

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O1

void __thiscall
CAddress::SerializationOps<ParamsStream<DataStream&,CAddress::SerParams>,CAddress,ActionUnserialize>
          (CAddress *this,ParamsStream<DataStream_&,_CAddress::SerParams> *obj,undefined8 param_3,
          size_t param_4)

{
  SerParams *pSVar1;
  char *pcVar2;
  ServiceFlags SVar3;
  SerParams *pSVar4;
  long in_FS_OFFSET;
  bool bVar5;
  SerParams ser_params;
  uint32_t obj_1;
  undefined1 local_4c [4];
  ServiceFlags local_48;
  ParamsStream<DataStream_&,_CAddress::SerParams> *local_40;
  direct_or_indirect local_38;
  
  local_38._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = obj->m_params;
  if (pSVar1->fmt == Network) {
    bVar5 = (pSVar1->super_SerParams).enc == V2;
  }
  else {
    if (pSVar1->fmt != Disk) {
      __assert_fail("params.fmt == Format::Network",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/protocol.h"
                    ,0x1b2,
                    "static void CAddress::SerializationOps(Type &, Stream &, Operation) [Stream = ParamsStream<DataStream &, CAddress::SerParams>, Type = CAddress, Operation = ActionUnserialize]"
                   );
    }
    DataStream::read(obj->m_substream,(int)&local_48,(void *)0x4,param_4);
    bVar5 = (local_48 & 0xfff80000) != NODE_NONE;
    if ((bVar5) &&
       ((((undefined4)local_48 & 0xfff80000) != 0x20000000 || ((pSVar1->super_SerParams).enc != V2))
       )) {
      pcVar2 = (char *)__cxa_allocate_exception(0x20);
      local_40 = (ParamsStream<DataStream_&,_CAddress::SerParams> *)std::iostream_category();
      local_48 = CONCAT44(local_48._4_4_,1);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar2,(error_code *)"Unsupported CAddress disk format version");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38._8_8_) {
        __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_004e12ac;
    }
  }
  DataStream::read(obj->m_substream,(int)&local_48,(void *)0x4,param_4);
  (this->nTime).__d.__r = local_48 & 0xffffffff;
  if (bVar5) {
    SVar3 = ReadCompactSize<ParamsStream<DataStream&,CAddress::SerParams>>(obj,false);
    this->nServices = SVar3;
    pSVar4 = &CNetAddr::V2;
  }
  else {
    local_48 = NODE_NONE;
    DataStream::read(obj->m_substream,(int)&local_48,&DAT_00000008,param_4);
    this->nServices = local_48;
    pSVar4 = &CNetAddr::V1;
  }
  local_4c = (undefined1  [4])pSVar4->enc;
  local_48 = (ServiceFlags)local_4c;
  local_38.indirect_contents.indirect = (char *)&(this->super_CService).port;
  local_40 = obj;
  ActionUnserialize::
  SerReadWriteMany<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,CNetAddr&,Wrapper<CustomUintFormatter<2,true>,unsigned_short&>>
            ((ActionUnserialize *)&local_48,
             (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *
             )this,(CNetAddr *)&local_38.indirect_contents,
             (Wrapper<CustomUintFormatter<2,_true>,_unsigned_short_&> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38._8_8_) {
    return;
  }
LAB_004e12ac:
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CAddress, obj)
    {
        bool use_v2;
        auto& params = SER_PARAMS(SerParams);
        if (params.fmt == Format::Disk) {
            // In the disk serialization format, the encoding (v1 or v2) is determined by a flag version
            // that's part of the serialization itself. ADDRV2_FORMAT in the stream version only determines
            // whether V2 is chosen/permitted at all.
            uint32_t stored_format_version = DISK_VERSION_INIT;
            if (params.enc == Encoding::V2) stored_format_version |= DISK_VERSION_ADDRV2;
            READWRITE(stored_format_version);
            stored_format_version &= ~DISK_VERSION_IGNORE_MASK; // ignore low bits
            if (stored_format_version == 0) {
                use_v2 = false;
            } else if (stored_format_version == DISK_VERSION_ADDRV2 && params.enc == Encoding::V2) {
                // Only support v2 deserialization if V2 is set.
                use_v2 = true;
            } else {
                throw std::ios_base::failure("Unsupported CAddress disk format version");
            }
        } else {
            assert(params.fmt == Format::Network);
            // In the network serialization format, the encoding (v1 or v2) is determined directly by
            // the value of enc in the stream params, as no explicitly encoded version
            // exists in the stream.
            use_v2 = params.enc == Encoding::V2;
        }

        READWRITE(Using<LossyChronoFormatter<uint32_t>>(obj.nTime));
        // nServices is serialized as CompactSize in V2; as uint64_t in V1.
        if (use_v2) {
            uint64_t services_tmp;
            SER_WRITE(obj, services_tmp = obj.nServices);
            READWRITE(Using<CompactSizeFormatter<false>>(services_tmp));
            SER_READ(obj, obj.nServices = static_cast<ServiceFlags>(services_tmp));
        } else {
            READWRITE(Using<CustomUintFormatter<8>>(obj.nServices));
        }
        // Invoke V1/V2 serializer for CService parent object.
        const auto ser_params{use_v2 ? CNetAddr::V2 : CNetAddr::V1};
        READWRITE(ser_params(AsBase<CService>(obj)));
    }